

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

block_s * block_new(void)

{
  uint16_t *puVar1;
  fio_ls_embd_s *pfVar2;
  block_s *pbVar3;
  long lVar4;
  fio_lock_i ret;
  fio_lock_i ret_1;
  fio_lock_i ret_2;
  
  fio_lock(&memory.lock);
  pfVar2 = fio_ls_embd_pop(&memory.available);
  if (pfVar2 == (fio_ls_embd_s *)0x0) {
    pbVar3 = (block_s *)sys_alloc(0x800000,'\0');
    if (pbVar3 == (block_s *)0x0) {
      LOCK();
      UNLOCK();
      pbVar3 = (block_s *)0x0;
    }
    else {
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7170): memory allocator allocated %p from the system"
                       ,pbVar3);
      }
      pbVar3->parent = pbVar3;
      *(fio_ls_embd_s **)&pbVar3->ref = (fio_ls_embd_s *)0x1000000020001;
      for (lVar4 = 0x8000; (int)lVar4 != 0x800000; lVar4 = lVar4 + 0x8000) {
        *(block_s **)((long)&pbVar3->parent + lVar4) = pbVar3;
        *(undefined8 *)((long)&pbVar3->ref + lVar4) = 0x1000000020001;
        pfVar2 = (fio_ls_embd_s *)((long)&pbVar3[1].parent + lVar4);
        *(fio_ls_embd_s **)((long)&pbVar3[1].parent + lVar4) = memory.available.prev;
        *(anon_struct_32_4_90625080 **)((long)&pbVar3[1].ref + lVar4) = &memory;
        (memory.available.prev)->next = pfVar2;
        memory.available.prev = pfVar2;
      }
      LOCK();
      UNLOCK();
    }
  }
  else {
    pbVar3 = (block_s *)(pfVar2 + -1);
    if (((ulong)pbVar3 & 0x7fff) != 0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7159) Memory allocator error! double `fio_free`?\n"
                      );
      }
      perror("     errno");
      exit(-1);
    }
    *(undefined4 *)&pfVar2[-1].next = 0x20001;
    pfVar2->prev = (fio_ls_embd_s *)0x0;
    pfVar2->next = (fio_ls_embd_s *)0x0;
    LOCK();
    puVar1 = &pbVar3->parent->root_ref;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
    LOCK();
    UNLOCK();
  }
  memory.lock = '\0';
  return pbVar3;
}

Assistant:

static inline block_s *block_new(void) {
  block_s *blk = NULL;

  fio_lock(&memory.lock);
  blk = (block_s *)fio_ls_embd_pop(&memory.available);
  if (blk) {
    blk = (block_s *)FIO_LS_EMBD_OBJ(block_node_s, node, blk);
    FIO_ASSERT(((uintptr_t)blk & FIO_MEMORY_BLOCK_MASK) == 0,
               "Memory allocator error! double `fio_free`?\n");
    block_init(blk); /* must be performed within lock */
    fio_unlock(&memory.lock);
    return blk;
  }
  /* collect memory from the system */
  blk = sys_alloc(FIO_MEMORY_BLOCK_SIZE * FIO_MEMORY_BLOCKS_PER_ALLOCATION, 0);
  if (!blk) {
    fio_unlock(&memory.lock);
    return NULL;
  }
  FIO_LOG_DEBUG("memory allocator allocated %p from the system", (void *)blk);
  FIO_MEMORY_ON_BLOCK_ALLOC();
  block_init_root(blk, blk);
  /* the extra memory goes into the memory pool. initialize + linke-list. */
  block_node_s *tmp = (block_node_s *)blk;
  for (int i = 1; i < FIO_MEMORY_BLOCKS_PER_ALLOCATION; ++i) {
    tmp = (block_node_s *)((uintptr_t)tmp + FIO_MEMORY_BLOCK_SIZE);
    block_init_root((block_s *)tmp, blk);
    fio_ls_embd_push(&memory.available, &tmp->node);
  }
  fio_unlock(&memory.lock);
  /* return the root block (which isn't in the memory pool). */
  return blk;
}